

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::moveContents
          (UniformCollection *this,UniformCollection *receiver)

{
  Uniform *__first;
  Uniform *__last;
  pointer ppSVar1;
  pointer ppSVar2;
  int i;
  long lVar3;
  long lVar4;
  int i_1;
  
  lVar4 = 0;
  lVar3 = 0;
  while( true ) {
    __first = (this->m_uniforms).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = (this->m_uniforms).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((int)(((long)__last - (long)__first) / 0x38) <= lVar3) break;
    addUniform(receiver,(Uniform *)((long)&(__first->name)._M_dataplus._M_p + lVar4));
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x38;
  }
  if (__last != __first) {
    std::_Destroy<deqp::gles31::Functional::(anonymous_namespace)::Uniform*>(__first,__last);
    (this->m_uniforms).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first;
  }
  lVar3 = 0;
  while( true ) {
    ppSVar1 = (this->m_structTypes).
              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar2 = (this->m_structTypes).
              super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppSVar2 - (long)ppSVar1) >> 3) <= lVar3) break;
    addStructType(receiver,ppSVar1[lVar3]);
    lVar3 = lVar3 + 1;
  }
  if (ppSVar2 != ppSVar1) {
    (this->m_structTypes).
    super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  return;
}

Assistant:

void moveContents (UniformCollection& receiver)
	{
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			receiver.addUniform(m_uniforms[i]);
		m_uniforms.clear();

		for (int i = 0; i < (int)m_structTypes.size(); i++)
			receiver.addStructType(m_structTypes[i]);
		m_structTypes.clear();
	}